

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os-test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_9703::MemoryMappedFileTest_DoubleMap_Test::TestBody
          (MemoryMappedFileTest_DoubleMap_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  regex_t *prVar2;
  bool bVar3;
  bool bVar4;
  char cVar5;
  bool bVar6;
  int iVar7;
  long *plVar8;
  size_t sVar9;
  char *pcVar10;
  long *plVar11;
  StringRef data;
  StringRef data_00;
  File file2;
  File file1;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_1;
  MemoryMappedFile<fmt::File> f;
  string filename1;
  string filename2;
  File FStack_138;
  File local_134;
  AssertHelper local_130;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_128;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  MemoryMappedFileBase local_f8;
  CStringRef local_e0;
  long local_d8;
  long local_d0;
  long lStack_c8;
  RE local_c0;
  
  (anonymous_namespace)::GetExecutableDir_abi_cxx11_();
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_c0);
  plVar11 = plVar8 + 2;
  if ((long *)*plVar8 == plVar11) {
    local_d0 = *plVar11;
    lStack_c8 = plVar8[3];
    local_e0.data_ = (char *)&local_d0;
  }
  else {
    local_d0 = *plVar11;
    local_e0.data_ = (char *)*plVar8;
  }
  local_d8 = plVar8[1];
  *plVar8 = (long)plVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  prVar2 = &local_c0.full_regex_;
  if ((regex_t *)local_c0.pattern_ != prVar2) {
    operator_delete(local_c0.pattern_,(ulong)(local_c0.full_regex_.buffer + 1));
  }
  data.size_ = 3;
  data.data_ = "abc";
  WriteFile(local_e0,data);
  local_f8.start_ = (char *)0x0;
  local_f8.size_ = 0;
  fmt::File::File(&local_134,local_e0,0);
  sVar9 = fmt::File::size(&local_134);
  mp::MemoryMappedFile<fmt::File>::map((MemoryMappedFile<fmt::File> *)&local_f8,&local_134,sVar9);
  (anonymous_namespace)::GetExecutableDir_abi_cxx11_();
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_118);
  plVar11 = plVar8 + 2;
  if ((regex_t *)*plVar8 == (regex_t *)plVar11) {
    local_c0.full_regex_.buffer = (re_dfa_t *)*plVar11;
    local_c0.full_regex_.allocated = plVar8[3];
    local_c0.pattern_ = (char *)prVar2;
  }
  else {
    local_c0.full_regex_.buffer = (re_dfa_t *)*plVar11;
    local_c0.pattern_ = (char *)*plVar8;
  }
  local_c0._8_8_ = plVar8[1];
  *plVar8 = (long)plVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  paVar1 = &local_118.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != paVar1) {
    operator_delete(local_118._M_dataplus._M_p,
                    CONCAT44(local_118.field_2._M_allocated_capacity._4_4_,
                             local_118.field_2._M_allocated_capacity._0_4_) + 1);
  }
  data_00.size_ = 4;
  data_00.data_ = "defg";
  WriteFile((CStringRef)local_c0.pattern_,data_00);
  fmt::File::File(&FStack_138,(CStringRef)local_c0.pattern_,0);
  sVar9 = fmt::File::size(&FStack_138);
  mp::MemoryMappedFile<fmt::File>::map((MemoryMappedFile<fmt::File> *)&local_f8,&FStack_138,sVar9);
  local_118._M_dataplus._M_p = (pointer)paVar1;
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8.start_ ==
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::__throw_logic_error("basic_string::_M_construct null not valid");
  }
  local_118.field_2._M_allocated_capacity._0_4_ = *(undefined4 *)local_f8.start_;
  local_118._M_string_length = (size_type)&DAT_00000004;
  local_118.field_2._M_allocated_capacity._4_4_ =
       local_118.field_2._M_allocated_capacity._4_4_ & 0xffffff00;
  testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
            ((internal *)&local_128,"\"defg\"","std::string(f.start(), 4)",(char (*) [5])"defg",
             &local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != paVar1) {
    operator_delete(local_118._M_dataplus._M_p,
                    CONCAT44(local_118.field_2._M_allocated_capacity._4_4_,
                             local_118.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if (local_128.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_118);
    if (local_120.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar10 = "";
    }
    else {
      pcVar10 = ((local_120.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_130,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/os-test.cc",0x106,
               pcVar10);
    testing::internal::AssertHelper::operator=(&local_130,(Message *)&local_118);
    testing::internal::AssertHelper::~AssertHelper(&local_130);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_118._M_dataplus._M_p + 8))();
      }
      local_118._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_120,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_130.data_._0_4_ = 4;
  local_128.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8.size_;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)&local_118,"4u","f.size()",(uint *)&local_130,(unsigned_long *)&local_128);
  if ((char)local_118._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_128);
    if ((undefined8 *)local_118._M_string_length == (undefined8 *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = *(char **)local_118._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_130,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/os-test.cc",0x107,
               pcVar10);
    testing::internal::AssertHelper::operator=(&local_130,(Message *)&local_128);
    testing::internal::AssertHelper::~AssertHelper(&local_130);
    if (local_128.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         (local_128.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_128.ptr_ + 8))();
      }
      local_128.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_118._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  fmt::File::~File(&FStack_138);
  if ((regex_t *)local_c0.pattern_ != prVar2) {
    operator_delete(local_c0.pattern_,(ulong)(local_c0.full_regex_.buffer + 1));
  }
  fmt::File::~File(&local_134);
  mp::internal::MemoryMappedFileBase::~MemoryMappedFileBase(&local_f8);
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    testing::internal::RE::Init(&local_c0,"");
    bVar4 = testing::internal::DeathTest::Create
                      ("(void)*start",&local_c0,
                       "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/os-test.cc"
                       ,0x109,(DeathTest **)&local_f8);
    bVar3 = true;
    if (bVar4) {
      if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8.start_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        local_128.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             local_f8.start_;
        iVar7 = (**(code **)(*(long *)local_f8.start_ + 0x10))();
        pcVar10 = local_f8.start_;
        if (iVar7 == 0) {
          iVar7 = (**(code **)(*(long *)local_f8.start_ + 0x18))(local_f8.start_);
          bVar3 = testing::internal::ExitedUnsuccessfully(iVar7);
          cVar5 = (**(code **)(*(long *)pcVar10 + 0x20))(pcVar10,bVar3);
          if (cVar5 != '\0') goto LAB_001113b8;
          bVar3 = true;
          bVar4 = false;
        }
        else {
          if (iVar7 == 1) {
            testing::internal::AlwaysTrue();
            (**(code **)(*(long *)local_f8.start_ + 0x28))(local_f8.start_,2);
            (**(code **)(*(long *)pcVar10 + 0x28))(pcVar10,0);
          }
LAB_001113b8:
          bVar3 = false;
          bVar4 = true;
        }
        if (local_128.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar6 = testing::internal::IsTrue(true);
          if ((bVar6) &&
             (local_128.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_128.ptr_ + 8))();
          }
          local_128.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
        if (!bVar4) goto LAB_001113f1;
      }
      bVar3 = false;
    }
LAB_001113f1:
    testing::internal::RE::~RE(&local_c0);
    if (!bVar3) goto LAB_00111474;
  }
  testing::Message::Message((Message *)&local_c0);
  pcVar10 = testing::internal::DeathTest::LastMessage();
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_118,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/os-test.cc",0x109,
             pcVar10);
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_118,(Message *)&local_c0);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_118);
  if ((long *)local_c0.pattern_ != (long *)0x0) {
    bVar3 = testing::internal::IsTrue(true);
    if ((bVar3) && ((long *)local_c0.pattern_ != (long *)0x0)) {
      (**(code **)(*(long *)local_c0.pattern_ + 8))();
    }
    local_c0.pattern_ = (char *)0x0;
  }
LAB_00111474:
  if ((long *)local_e0.data_ != &local_d0) {
    operator_delete(local_e0.data_,local_d0 + 1);
  }
  return;
}

Assistant:

TEST(MemoryMappedFileTest, DoubleMap) {
  std::string filename1 = GetExecutableDir() + "/test1";
  WriteFile(filename1, "abc");
  const volatile char *start = 0;
  {
    MemoryMappedFile<> f;
    File file1(filename1, File::RDONLY);
    f.map(file1, static_cast<std::size_t>(file1.size()));
    std::string filename2 = GetExecutableDir() + "/test2";
    WriteFile(filename2, "defg");
    File file2(filename2, File::RDONLY);
    f.map(file2, static_cast<std::size_t>(file2.size()));
    start = f.start();
    EXPECT_EQ("defg", std::string(f.start(), 4));
    EXPECT_EQ(4u, f.size());
  }
  EXPECT_DEATH((void)*start, "");
}